

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWSkew.h
# Opt level: O2

int __thiscall
COLLADAFW::Skew::clone(Skew *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Skew *this_00;
  
  this_00 = (Skew *)operator_new(0x60);
  Skew(this_00,this);
  return (int)this_00;
}

Assistant:

virtual Skew* clone() const { return new Skew(*this); }